

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bold.cpp
# Opt level: O3

Element __thiscall ftxui::bold(ftxui *this,Element *child)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  NodeDecorator *this_00;
  Element EVar3;
  Element local_38;
  
  puVar1 = (undefined8 *)operator_new(0x70);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0011e488;
  this_00 = (NodeDecorator *)(puVar1 + 2);
  local_38.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  NodeDecorator::NodeDecorator(this_00,&local_38);
  (this_00->super_Node)._vptr_Node = (_func_int **)&PTR__Node_0011e4d8;
  _Var2._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  *(NodeDecorator **)this = this_00;
  *(undefined8 **)(this + 8) = puVar1;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element bold(Element child) {
  return std::make_shared<Bold>(std::move(child));
}